

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void set_prisoners_and_guards_route(tgestate_t *state,route_t *proute)

{
  undefined8 in_RSI;
  tgestate_t *in_RDI;
  uint8_t iters;
  route_t unaff_retaddr;
  character_t *pchars;
  route_t route;
  undefined1 local_21;
  
  local_21 = '\n';
  do {
    set_character_route(in_RDI,(character_t)((ulong)in_RSI >> 0x38),unaff_retaddr);
    local_21 = local_21 + -1;
  } while (local_21 != '\0');
  return;
}

Assistant:

static void set_prisoners_and_guards_route(tgestate_t *state,
                                     const route_t    *proute)
{
  route_t            route;  /* new var */
  const character_t *pchars; /* was HL */
  uint8_t            iters;  /* was B */

  assert(state != NULL);
  ASSERT_ROUTE_VALID(*proute);

  route = *proute; /* Conv: Keep a local copy of route. */

  pchars = &prisoners_and_guards[0];
  iters = NELEMS(prisoners_and_guards);
  do
  {
    set_character_route(state, *pchars, route);
    route.index++;
    pchars++;
  }
  while (--iters);
}